

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O0

Vector * __thiscall Clusters::operator[](Clusters *this,unsigned_long index)

{
  ostream *poVar1;
  ulong in_RSI;
  long *in_RDI;
  
  if (in_RSI < (ulong)in_RDI[1]) {
    return *(Vector **)(*in_RDI + in_RSI * 8);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Requested an invalid cluster index ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," out of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[1]);
  poVar1 = std::operator<<(poVar1," allocated clusters ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

Vector *operator[](unsigned long index) {
    if (index < allocated_clusters) {
      return list_of_clusters[index];
    } else {
      cerr << "Requested an invalid cluster index " << index << " out of "
           << allocated_clusters << " allocated clusters " << endl;
      ;
      exit(1);
    }
  }